

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseScript(JSONParser *this,Script *out_script)

{
  bool bVar1;
  Result RVar2;
  CommandPtr local_40;
  CommandPtr command;
  bool first;
  Script *out_script_local;
  JSONParser *this_local;
  
  RVar2 = Expect(this,"{");
  bVar1 = wabt::Failed(RVar2);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ParseKeyStringValue(this,"source_filename",&out_script->filename);
    bVar1 = wabt::Failed(RVar2);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = Expect(this,",");
      bVar1 = wabt::Failed(RVar2);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar2 = ExpectKey(this,"commands");
        bVar1 = wabt::Failed(RVar2);
        if (bVar1) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          command._M_t.
          super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
          super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
          super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl._4_4_ = Expect(this,"[");
          bVar1 = wabt::Failed(command._M_t.
                               super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>
                               .super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl._4_4_
                              );
          if (bVar1) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            command._M_t.
            super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
            super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
            super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl._3_1_ = 1;
            do {
              bVar1 = Match(this,"]");
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                RVar2 = Expect(this,"}");
                bVar1 = wabt::Failed(RVar2);
                if (!bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
                  return (Result)this_local._4_4_;
                }
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>::
              unique_ptr<std::default_delete<spectest::Command>,void>
                        ((unique_ptr<spectest::Command,std::default_delete<spectest::Command>> *)
                         &local_40);
              if ((command._M_t.
                   super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>
                   .super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl._3_1_ & 1) == 0)
              {
                RVar2 = Expect(this,",");
                bVar1 = wabt::Failed(RVar2);
                if (!bVar1) goto LAB_002c0110;
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
LAB_002c0110:
                RVar2 = ParseCommand(this,&local_40);
                bVar1 = wabt::Failed(RVar2);
                if (bVar1) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  bVar1 = true;
                }
                else {
                  std::
                  vector<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
                  ::push_back(&out_script->commands,&local_40);
                  command._M_t.
                  super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>
                  .super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl._3_1_ = 0;
                  bVar1 = false;
                }
              }
              std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>::
              ~unique_ptr(&local_40);
            } while (!bVar1);
          }
        }
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseScript(Script* out_script) {
  EXPECT("{");
  PARSE_KEY_STRING_VALUE("source_filename", &out_script->filename);
  EXPECT(",");
  EXPECT_KEY("commands");
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    CommandPtr command;
    if (!first) {
      EXPECT(",");
    }
    CHECK_RESULT(ParseCommand(&command));
    out_script->commands.push_back(std::move(command));
    first = false;
  }
  EXPECT("}");
  return wabt::Result::Ok;
}